

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>_>::
int_writer<char,_duckdb_fmt::v6::basic_format_specs<char>_>::on_num
          (int_writer<char,_duckdb_fmt::v6::basic_format_specs<char>_> *this)

{
  char cVar1;
  undefined8 *puVar2;
  locale_ref loc;
  string_view prefix;
  format_specs specs;
  num_writer f;
  bool bVar3;
  char cVar4;
  bool bVar5;
  int iVar6;
  undefined4 uVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var11;
  reference pcVar12;
  undefined8 uVar13;
  char *pcVar14;
  long in_RDI;
  string_view sVar15;
  const_iterator group;
  int size;
  int num_digits;
  char sep;
  string groups;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffee8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  undefined1 in_stack_ffffffffffffff7c [12];
  undefined6 uVar16;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 uVar17;
  string asStack_28 [40];
  
  loc.locale_._4_4_ = in_stack_fffffffffffffefc;
  loc.locale_._0_4_ = in_stack_fffffffffffffef8;
  grouping<char>(loc);
  uVar10 = std::__cxx11::string::empty();
  if ((uVar10 & 1) == 0) {
    cVar1 = *(char *)(*(long *)(in_RDI + 8) + 0x10);
    uVar17 = CONCAT13(cVar1,(int3)in_stack_ffffffffffffffbc);
    if (cVar1 == '\0') {
      on_dec((int_writer<char,_duckdb_fmt::v6::basic_format_specs<char>_> *)
             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    }
    else {
      iVar6 = count_digits(*(uint32_t *)(in_RDI + 0x10));
      iVar8 = iVar6;
      _Var11._M_current = (char *)std::__cxx11::string::cbegin();
      while( true ) {
        uVar7 = std::__cxx11::string::cend();
        bVar3 = __gnu_cxx::
                operator!=<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
        bVar5 = false;
        if (bVar3) {
          iVar9 = iVar8;
          pcVar12 = __gnu_cxx::
                    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)&stack0xffffffffffffffa8);
          bVar5 = false;
          bVar3 = *pcVar12 < iVar8;
          iVar8 = iVar9;
          if (bVar3) {
            pcVar12 = __gnu_cxx::
                      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)&stack0xffffffffffffffa8);
            bVar5 = false;
            iVar8 = iVar9;
            if ('\0' < *pcVar12) {
              pcVar12 = __gnu_cxx::
                        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)&stack0xffffffffffffffa8);
              cVar1 = *pcVar12;
              cVar4 = max_value<char>();
              bVar5 = cVar1 != cVar4;
              iVar8 = iVar9;
            }
          }
        }
        if (!bVar5) break;
        iVar6 = iVar6 + 1;
        pcVar12 = __gnu_cxx::
                  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&stack0xffffffffffffffa8);
        iVar8 = iVar8 - *pcVar12;
        __gnu_cxx::
        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&stack0xffffffffffffffa8);
      }
      uVar13 = std::__cxx11::string::cend();
      bVar5 = __gnu_cxx::
              operator==<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      if (bVar5) {
        iVar9 = iVar8 + -1;
        pcVar14 = (char *)std::__cxx11::string::back();
        iVar6 = iVar9 / (int)*pcVar14 + iVar6;
      }
      sVar15 = get_prefix((int_writer<char,_duckdb_fmt::v6::basic_format_specs<char>_> *)0x2b466e0);
      puVar2 = *(undefined8 **)(in_RDI + 8);
      prefix._4_12_ = in_stack_ffffffffffffff7c;
      prefix.data_._0_4_ = *(undefined4 *)(puVar2 + 2);
      uVar16 = (undefined6)((ulong)uVar13 >> 0x10);
      specs.type = (char)uVar13;
      specs._9_1_ = (char)((ulong)uVar13 >> 8);
      specs.fill.data_[0] = (char)uVar16;
      specs.fill.data_[1] = (char)((uint6)uVar16 >> 8);
      specs.fill.data_[2] = (char)((uint6)uVar16 >> 0x10);
      specs.fill.data_[3] = (char)((uint6)uVar16 >> 0x18);
      specs.fill.data_[4] = (char)((uint6)uVar16 >> 0x20);
      specs.fill.data_[5] = (char)((uint6)uVar16 >> 0x28);
      specs.width = (int)sVar15.size_;
      specs.precision = (int)(sVar15.size_ >> 0x20);
      specs._16_4_ = uVar7;
      f.groups._0_4_ = in_stack_ffffffffffffffb0;
      f._0_8_ = _Var11._M_current;
      f.groups._4_4_ = iVar6;
      f._16_4_ = iVar8;
      f._20_4_ = uVar17;
      write_int<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>_>::int_writer<char,_duckdb_fmt::v6::basic_format_specs<char>_>::num_writer>
                ((basic_writer<duckdb_fmt::v6::buffer_range<char>_> *)puVar2[1],
                 (int)((ulong)*puVar2 >> 0x20),prefix,specs,f);
    }
  }
  else {
    on_dec((int_writer<char,_duckdb_fmt::v6::basic_format_specs<char>_> *)
           CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  }
  std::__cxx11::string::~string(asStack_28);
  return;
}

Assistant:

void on_num() {
      std::string groups = grouping<char_type>(writer.locale_);
      if (groups.empty()) return on_dec();
      auto sep = specs.thousands;
      if (!sep) return on_dec();
      int num_digits = count_digits(abs_value);
      int size = num_digits;
      std::string::const_iterator group = groups.cbegin();
      while (group != groups.cend() && num_digits > *group && *group > 0 &&
             *group != max_value<char>()) {
        size += sep_size;
        num_digits -= *group;
        ++group;
      }
      if (group == groups.cend())
        size += sep_size * ((num_digits - 1) / groups.back());
      writer.write_int(size, get_prefix(), specs,
                       num_writer{abs_value, size, groups, static_cast<char_type>(sep)});
    }